

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void selectInnerLoop(Parse *pParse,Select *p,int srcTab,SortCtx *pSort,DistinctCtx *pDistinct,
                    SelectDest *pDest,int iContinue,int iBreak)

{
  Vdbe *p_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  VdbeOp *pVVar6;
  long *in_RCX;
  Parse *pParse_00;
  int in_EDX;
  long *in_RSI;
  Parse *in_RDI;
  long in_R8;
  byte *in_R9;
  ExprList *pSO;
  int addrTest;
  int r3;
  int r2_1;
  int r1_3;
  int nKey;
  int r1_2;
  int r2;
  int addr;
  int r1_1;
  int r1;
  CollSeq *pColl;
  int regPrev;
  int iJump;
  VdbeOp *pOp;
  int j;
  ExprList *pEList;
  u8 ecelFlags;
  int regOrig;
  int regResult;
  RowLoadInfo sRowLoadInfo;
  int nPrefixReg;
  int nResultCol;
  int iParm;
  int eDest;
  int hasDistinct;
  int i;
  Vdbe *v;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  Parse *in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff38;
  uint iTab;
  Parse *in_stack_ffffffffffffff40;
  Vdbe *p_01;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  byte local_61;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int iVar7;
  undefined4 uVar8;
  uint uVar9;
  int in_stack_ffffffffffffffc4;
  int iVar10;
  long *local_20;
  
  p_00 = in_RDI->pVdbe;
  uVar1 = (uint)*in_R9;
  uVar8 = *(undefined4 *)(in_R9 + 4);
  iVar7 = 0;
  if (in_R8 == 0) {
    iTab = 0;
  }
  else {
    iTab = (uint)*(byte *)(in_R8 + 1);
  }
  local_20 = in_RCX;
  if ((in_RCX != (long *)0x0) && (*in_RCX == 0)) {
    local_20 = (long *)0x0;
  }
  uVar9 = iTab;
  if ((local_20 == (long *)0x0) && (iTab == 0)) {
    codeOffset((Vdbe *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28
              );
  }
  iVar4 = *(int *)*in_RSI;
  if (*(int *)(in_R9 + 8) == 0) {
    if (local_20 != (long *)0x0) {
      iVar7 = *(int *)*local_20;
      if ((*(byte *)((long)local_20 + 0x24) & 1) == 0) {
        iVar7 = iVar7 + 1;
      }
      in_RDI->nMem = iVar7 + in_RDI->nMem;
    }
    *(int *)(in_R9 + 8) = in_RDI->nMem + 1;
    in_RDI->nMem = iVar4 + in_RDI->nMem;
  }
  else if (in_RDI->nMem < *(int *)(in_R9 + 8) + iVar4) {
    in_RDI->nMem = iVar4 + in_RDI->nMem;
  }
  *(int *)(in_R9 + 0xc) = iVar4;
  iVar5 = *(int *)(in_R9 + 8);
  if (in_EDX < 0) {
    if (uVar1 != 3) {
      if (((uVar1 == 10) || (uVar1 == 9)) || (uVar1 == 0xd)) {
        local_61 = 1;
      }
      else {
        local_61 = 0;
      }
      if (((local_20 != (long *)0x0) && (uVar9 == 0)) && ((uVar1 != 0xc && (uVar1 != 0xe)))) {
        local_61 = local_61 | 0xc;
        for (iVar3 = (int)local_20[1]; iVar3 < *(int *)*local_20; iVar3 = iVar3 + 1) {
          uVar2 = (uint)*(ushort *)(*local_20 + (long)iVar3 * 0x20 + 0x24);
          if (uVar2 != 0) {
            *(short *)(*in_RSI + (long)(int)(uVar2 - 1) * 0x20 + 0x24) =
                 ((short)iVar3 + 1) - (short)(int)local_20[1];
          }
        }
        for (in_stack_ffffffffffffffc4 = 0; in_stack_ffffffffffffffc4 < *(int *)*in_RSI;
            in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + 1) {
          if ((short)((int *)*in_RSI)[(long)in_stack_ffffffffffffffc4 * 8 + 9] != 0) {
            iVar4 = iVar4 + -1;
          }
        }
      }
      in_stack_ffffffffffffffac = CONCAT31((int3)((uint)in_stack_ffffffffffffffac >> 8),local_61);
      in_stack_ffffffffffffffa8 = iVar5;
      if ((((int)in_RSI[2] == 0) || ((local_61 & 8) == 0)) || (iVar7 < 1)) {
        innerLoopLoadRow(in_stack_ffffffffffffff30,
                         (Select *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                         (RowLoadInfo *)0x1b569a);
      }
      else {
        local_20[5] = (long)&stack0xffffffffffffffa8;
      }
    }
  }
  else {
    for (in_stack_ffffffffffffffc4 = 0; in_stack_ffffffffffffffc4 < iVar4;
        in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + 1) {
      sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                        (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                        (int)in_stack_ffffffffffffff40,iTab,in_stack_ffffffffffffff38);
    }
  }
  if (uVar9 != 0) {
    in_stack_ffffffffffffff38 = (uint)*(byte *)(in_R8 + 1);
    iVar3 = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
    if (in_stack_ffffffffffffff38 == 1) {
      sqlite3VdbeChangeToNoop((Vdbe *)CONCAT44(iTab,1),iVar3);
    }
    else if (in_stack_ffffffffffffff38 == 2) {
      iVar10 = in_RDI->nMem;
      in_RDI->nMem = iVar4 + in_RDI->nMem;
      sqlite3VdbeChangeToNoop((Vdbe *)CONCAT44(iTab,2),iVar3);
      pVVar6 = sqlite3VdbeGetOp(p_00,*(int *)(in_R8 + 8));
      pVVar6->opcode = 'I';
      pVVar6->p1 = 1;
      pVVar6->p2 = iVar10 + 1;
      sqlite3VdbeCurrentAddr(p_00);
      for (in_stack_ffffffffffffffc4 = 0; in_stack_ffffffffffffffc4 < iVar4;
          in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + 1) {
        sqlite3ExprCollSeq((Parse *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           (Expr *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        iVar3 = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
        if (in_stack_ffffffffffffffc4 < iVar4 + -1) {
          sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            iVar3,(int)in_stack_ffffffffffffff40,iTab,in_stack_ffffffffffffff38);
        }
        else {
          sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            iVar3,(int)in_stack_ffffffffffffff40,iTab,in_stack_ffffffffffffff38);
        }
        sqlite3VdbeChangeP4((Vdbe *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            in_stack_ffffffffffffff4c,(char *)in_stack_ffffffffffffff40,iTab);
        sqlite3VdbeChangeP5(p_00,0x80);
      }
      sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                        (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                        (int)in_stack_ffffffffffffff40,iTab,in_stack_ffffffffffffff38);
    }
    else {
      codeDistinct(in_stack_ffffffffffffff40,iTab,in_stack_ffffffffffffff38,iVar3,
                   (int)in_stack_ffffffffffffff30);
    }
    if (local_20 == (long *)0x0) {
      codeOffset((Vdbe *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                 in_stack_ffffffffffffff28);
    }
  }
  pParse_00 = (Parse *)(ulong)(uVar1 - 1);
  iVar3 = (int)in_R9;
  switch(pParse_00) {
  case (Parse *)0x0:
    iVar7 = sqlite3GetTempReg(in_RDI);
    sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                      (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),(int)in_stack_ffffffffffffff40
                      ,iTab,in_stack_ffffffffffffff38);
    sqlite3VdbeAddOp4Int
              ((Vdbe *)in_stack_ffffffffffffff40,iTab,in_stack_ffffffffffffff38,
               (int)((ulong)pParse_00 >> 0x20),(int)pParse_00,in_stack_ffffffffffffff2c);
    sqlite3ReleaseTempReg(in_RDI,iVar7);
    break;
  case (Parse *)0x1:
    sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                      (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),(int)in_stack_ffffffffffffff40
                      ,iTab,in_stack_ffffffffffffff38);
    break;
  case (Parse *)0x2:
    sqlite3VdbeAddOp2((Vdbe *)pParse_00,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0);
    break;
  default:
    break;
  case (Parse *)0x4:
  case (Parse *)0x5:
  case (Parse *)0xb:
  case (Parse *)0xd:
    sqlite3GetTempRange((Parse *)CONCAT44(iTab,in_stack_ffffffffffffff38),0);
    iVar3 = (int)in_R9;
    sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                      (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),(int)in_stack_ffffffffffffff40
                      ,iTab,in_stack_ffffffffffffff38);
    if (uVar1 == 6) {
      sqlite3VdbeCurrentAddr(p_00);
      sqlite3VdbeAddOp4Int
                ((Vdbe *)in_stack_ffffffffffffff40,iTab,in_stack_ffffffffffffff38,
                 (int)((ulong)pParse_00 >> 0x20),(int)pParse_00,in_stack_ffffffffffffff2c);
      sqlite3VdbeAddOp4Int
                ((Vdbe *)in_stack_ffffffffffffff40,iTab,in_stack_ffffffffffffff38,
                 (int)((ulong)pParse_00 >> 0x20),(int)pParse_00,in_stack_ffffffffffffff2c);
    }
    if (local_20 == (long *)0x0) {
      iVar7 = sqlite3GetTempReg(in_RDI);
      sqlite3VdbeAddOp2((Vdbe *)pParse_00,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0);
      sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                        (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                        (int)in_stack_ffffffffffffff40,iTab,in_stack_ffffffffffffff38);
      sqlite3VdbeChangeP5(p_00,8);
      sqlite3ReleaseTempReg(in_RDI,iVar7);
    }
    else {
      pushOntoSorter((Parse *)CONCAT44(in_stack_ffffffffffffffc4,uVar9),
                     (SortCtx *)CONCAT44(uVar1,uVar8),(Select *)CONCAT44(iVar4,iVar7),
                     in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,iVar5,iVar3);
      in_stack_ffffffffffffff28 = iVar7;
    }
    sqlite3ReleaseTempRange(pParse_00,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    break;
  case (Parse *)0x6:
  case (Parse *)0x7:
    iVar3 = 0;
    p_01 = *(Vdbe **)(in_R9 + 0x18);
    iVar7 = *(int *)&p_01->db;
    iVar4 = sqlite3GetTempReg(in_RDI);
    iVar5 = sqlite3GetTempRange((Parse *)CONCAT44(iTab,in_stack_ffffffffffffff38),
                                (int)((ulong)pParse_00 >> 0x20));
    iVar5 = iVar5 + iVar7 + 1;
    if (uVar1 == 8) {
      iVar3 = sqlite3VdbeAddOp4Int
                        (p_01,iTab,in_stack_ffffffffffffff38,(int)((ulong)pParse_00 >> 0x20),
                         (int)pParse_00,in_stack_ffffffffffffff2c);
    }
    sqlite3VdbeAddOp3((Vdbe *)CONCAT44(iVar5,iVar3),(int)((ulong)p_01 >> 0x20),(int)p_01,iTab,
                      in_stack_ffffffffffffff38);
    if (uVar1 == 8) {
      sqlite3VdbeAddOp2((Vdbe *)pParse_00,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0);
      sqlite3VdbeChangeP5(p_00,0x10);
    }
    for (iVar10 = 0; iVar10 < iVar7; iVar10 = iVar10 + 1) {
      sqlite3VdbeAddOp2((Vdbe *)pParse_00,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0);
    }
    sqlite3VdbeAddOp2((Vdbe *)pParse_00,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0);
    sqlite3VdbeAddOp3((Vdbe *)CONCAT44(iVar5,iVar3),(int)((ulong)p_01 >> 0x20),(int)p_01,iTab,
                      in_stack_ffffffffffffff38);
    sqlite3VdbeAddOp4Int
              (p_01,iTab,in_stack_ffffffffffffff38,(int)((ulong)pParse_00 >> 0x20),(int)pParse_00,
               in_stack_ffffffffffffff2c);
    if (iVar3 != 0) {
      sqlite3VdbeJumpHere((Vdbe *)pParse_00,in_stack_ffffffffffffff2c);
    }
    sqlite3ReleaseTempReg(in_RDI,iVar4);
    sqlite3ReleaseTempRange(pParse_00,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    break;
  case (Parse *)0x8:
  case (Parse *)0xc:
    if (local_20 == (long *)0x0) {
      if (uVar1 == 0xd) {
        sqlite3VdbeAddOp1((Vdbe *)pParse_00,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
      }
      else {
        sqlite3VdbeAddOp2((Vdbe *)pParse_00,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0);
      }
    }
    else {
      pushOntoSorter((Parse *)CONCAT44(in_stack_ffffffffffffffc4,uVar9),
                     (SortCtx *)CONCAT44(uVar1,uVar8),(Select *)CONCAT44(iVar4,iVar7),
                     in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,iVar5,iVar3);
      in_stack_ffffffffffffff28 = iVar7;
    }
    break;
  case (Parse *)0x9:
    if (local_20 != (long *)0x0) {
      pushOntoSorter((Parse *)CONCAT44(in_stack_ffffffffffffffc4,uVar9),
                     (SortCtx *)CONCAT44(uVar1,uVar8),(Select *)CONCAT44(iVar4,iVar7),
                     in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,iVar5,iVar3);
      in_stack_ffffffffffffff28 = iVar7;
    }
    break;
  case (Parse *)0xa:
    if (local_20 == (long *)0x0) {
      iVar7 = sqlite3GetTempReg(in_RDI);
      sqlite3VdbeAddOp4((Vdbe *)in_stack_ffffffffffffff40,iTab,in_stack_ffffffffffffff38,
                        (int)((ulong)pParse_00 >> 0x20),(int)pParse_00,
                        (char *)CONCAT44(in_stack_ffffffffffffff2c,iVar4),in_stack_ffffffffffffff50)
      ;
      sqlite3VdbeAddOp4Int
                ((Vdbe *)in_stack_ffffffffffffff40,iTab,in_stack_ffffffffffffff38,
                 (int)((ulong)pParse_00 >> 0x20),(int)pParse_00,in_stack_ffffffffffffff2c);
      sqlite3ReleaseTempReg(in_RDI,iVar7);
      in_stack_ffffffffffffff28 = iVar4;
    }
    else {
      pushOntoSorter((Parse *)CONCAT44(in_stack_ffffffffffffffc4,uVar9),
                     (SortCtx *)CONCAT44(uVar1,uVar8),(Select *)CONCAT44(iVar4,iVar7),
                     in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,iVar5,iVar3);
      in_stack_ffffffffffffff28 = iVar7;
    }
  }
  if ((local_20 == (long *)0x0) && ((int)in_RSI[2] != 0)) {
    sqlite3VdbeAddOp2((Vdbe *)pParse_00,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0);
  }
  return;
}

Assistant:

static void selectInnerLoop(
  Parse *pParse,          /* The parser context */
  Select *p,              /* The complete select statement being coded */
  int srcTab,             /* Pull data from this table if non-negative */
  SortCtx *pSort,         /* If not NULL, info on how to process ORDER BY */
  DistinctCtx *pDistinct, /* If not NULL, info on how to process DISTINCT */
  SelectDest *pDest,      /* How to dispose of the results */
  int iContinue,          /* Jump here to continue with next row */
  int iBreak              /* Jump here to break out of the inner loop */
){
  Vdbe *v = pParse->pVdbe;
  int i;
  int hasDistinct;            /* True if the DISTINCT keyword is present */
  int eDest = pDest->eDest;   /* How to dispose of results */
  int iParm = pDest->iSDParm; /* First argument to disposal method */
  int nResultCol;             /* Number of result columns */
  int nPrefixReg = 0;         /* Number of extra registers before regResult */
  RowLoadInfo sRowLoadInfo;   /* Info for deferred row loading */

  /* Usually, regResult is the first cell in an array of memory cells
  ** containing the current result row. In this case regOrig is set to the
  ** same value. However, if the results are being sent to the sorter, the
  ** values for any expressions that are also part of the sort-key are omitted
  ** from this array. In this case regOrig is set to zero.  */
  int regResult;              /* Start of memory holding current results */
  int regOrig;                /* Start of memory holding full result (or 0) */

  assert( v );
  assert( p->pEList!=0 );
  hasDistinct = pDistinct ? pDistinct->eTnctType : WHERE_DISTINCT_NOOP;
  if( pSort && pSort->pOrderBy==0 ) pSort = 0;
  if( pSort==0 && !hasDistinct ){
    assert( iContinue!=0 );
    codeOffset(v, p->iOffset, iContinue);
  }

  /* Pull the requested columns.
  */
  nResultCol = p->pEList->nExpr;

  if( pDest->iSdst==0 ){
    if( pSort ){
      nPrefixReg = pSort->pOrderBy->nExpr;
      if( !(pSort->sortFlags & SORTFLAG_UseSorter) ) nPrefixReg++;
      pParse->nMem += nPrefixReg;
    }
    pDest->iSdst = pParse->nMem+1;
    pParse->nMem += nResultCol;
  }else if( pDest->iSdst+nResultCol > pParse->nMem ){
    /* This is an error condition that can result, for example, when a SELECT
    ** on the right-hand side of an INSERT contains more result columns than
    ** there are columns in the table on the left.  The error will be caught
    ** and reported later.  But we need to make sure enough memory is allocated
    ** to avoid other spurious errors in the meantime. */
    pParse->nMem += nResultCol;
  }
  pDest->nSdst = nResultCol;
  regOrig = regResult = pDest->iSdst;
  if( srcTab>=0 ){
    for(i=0; i<nResultCol; i++){
      sqlite3VdbeAddOp3(v, OP_Column, srcTab, i, regResult+i);
      VdbeComment((v, "%s", p->pEList->a[i].zName));
    }
  }else if( eDest!=SRT_Exists ){
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    ExprList *pExtra = 0;
#endif
    /* If the destination is an EXISTS(...) expression, the actual
    ** values returned by the SELECT are not required.
    */
    u8 ecelFlags;    /* "ecel" is an abbreviation of "ExprCodeExprList" */
    ExprList *pEList;
    if( eDest==SRT_Mem || eDest==SRT_Output || eDest==SRT_Coroutine ){
      ecelFlags = SQLITE_ECEL_DUP;
    }else{
      ecelFlags = 0;
    }
    if( pSort && hasDistinct==0 && eDest!=SRT_EphemTab && eDest!=SRT_Table ){
      /* For each expression in p->pEList that is a copy of an expression in
      ** the ORDER BY clause (pSort->pOrderBy), set the associated 
      ** iOrderByCol value to one more than the index of the ORDER BY 
      ** expression within the sort-key that pushOntoSorter() will generate.
      ** This allows the p->pEList field to be omitted from the sorted record,
      ** saving space and CPU cycles.  */
      ecelFlags |= (SQLITE_ECEL_OMITREF|SQLITE_ECEL_REF);

      for(i=pSort->nOBSat; i<pSort->pOrderBy->nExpr; i++){
        int j;
        if( (j = pSort->pOrderBy->a[i].u.x.iOrderByCol)>0 ){
          p->pEList->a[j-1].u.x.iOrderByCol = i+1-pSort->nOBSat;
        }
      }
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
      selectExprDefer(pParse, pSort, p->pEList, &pExtra);
      if( pExtra && pParse->db->mallocFailed==0 ){
        /* If there are any extra PK columns to add to the sorter records,
        ** allocate extra memory cells and adjust the OpenEphemeral 
        ** instruction to account for the larger records. This is only
        ** required if there are one or more WITHOUT ROWID tables with
        ** composite primary keys in the SortCtx.aDefer[] array.  */
        VdbeOp *pOp = sqlite3VdbeGetOp(v, pSort->addrSortIndex);
        pOp->p2 += (pExtra->nExpr - pSort->nDefer);
        pOp->p4.pKeyInfo->nAllField += (pExtra->nExpr - pSort->nDefer);
        pParse->nMem += pExtra->nExpr;
      }
#endif

      /* Adjust nResultCol to account for columns that are omitted
      ** from the sorter by the optimizations in this branch */
      pEList = p->pEList;
      for(i=0; i<pEList->nExpr; i++){
        if( pEList->a[i].u.x.iOrderByCol>0
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
         || pEList->a[i].bSorterRef
#endif
        ){
          nResultCol--;
          regOrig = 0;
        }
      }

      testcase( regOrig );
      testcase( eDest==SRT_Set );
      testcase( eDest==SRT_Mem );
      testcase( eDest==SRT_Coroutine );
      testcase( eDest==SRT_Output );
      assert( eDest==SRT_Set || eDest==SRT_Mem 
           || eDest==SRT_Coroutine || eDest==SRT_Output );
    }
    sRowLoadInfo.regResult = regResult;
    sRowLoadInfo.ecelFlags = ecelFlags;
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    sRowLoadInfo.pExtra = pExtra;
    sRowLoadInfo.regExtraResult = regResult + nResultCol;
    if( pExtra ) nResultCol += pExtra->nExpr;
#endif
    if( p->iLimit
     && (ecelFlags & SQLITE_ECEL_OMITREF)!=0 
     && nPrefixReg>0
    ){
      assert( pSort!=0 );
      assert( hasDistinct==0 );
      pSort->pDeferredRowLoad = &sRowLoadInfo;
      regOrig = 0;
    }else{
      innerLoopLoadRow(pParse, p, &sRowLoadInfo);
    }
  }

  /* If the DISTINCT keyword was present on the SELECT statement
  ** and this row has been seen before, then do not make this row
  ** part of the result.
  */
  if( hasDistinct ){
    switch( pDistinct->eTnctType ){
      case WHERE_DISTINCT_ORDERED: {
        VdbeOp *pOp;            /* No longer required OpenEphemeral instr. */
        int iJump;              /* Jump destination */
        int regPrev;            /* Previous row content */

        /* Allocate space for the previous row */
        regPrev = pParse->nMem+1;
        pParse->nMem += nResultCol;

        /* Change the OP_OpenEphemeral coded earlier to an OP_Null
        ** sets the MEM_Cleared bit on the first register of the
        ** previous value.  This will cause the OP_Ne below to always
        ** fail on the first iteration of the loop even if the first
        ** row is all NULLs.
        */
        sqlite3VdbeChangeToNoop(v, pDistinct->addrTnct);
        pOp = sqlite3VdbeGetOp(v, pDistinct->addrTnct);
        pOp->opcode = OP_Null;
        pOp->p1 = 1;
        pOp->p2 = regPrev;

        iJump = sqlite3VdbeCurrentAddr(v) + nResultCol;
        for(i=0; i<nResultCol; i++){
          CollSeq *pColl = sqlite3ExprCollSeq(pParse, p->pEList->a[i].pExpr);
          if( i<nResultCol-1 ){
            sqlite3VdbeAddOp3(v, OP_Ne, regResult+i, iJump, regPrev+i);
            VdbeCoverage(v);
          }else{
            sqlite3VdbeAddOp3(v, OP_Eq, regResult+i, iContinue, regPrev+i);
            VdbeCoverage(v);
           }
          sqlite3VdbeChangeP4(v, -1, (const char *)pColl, P4_COLLSEQ);
          sqlite3VdbeChangeP5(v, SQLITE_NULLEQ);
        }
        assert( sqlite3VdbeCurrentAddr(v)==iJump || pParse->db->mallocFailed );
        sqlite3VdbeAddOp3(v, OP_Copy, regResult, regPrev, nResultCol-1);
        break;
      }

      case WHERE_DISTINCT_UNIQUE: {
        sqlite3VdbeChangeToNoop(v, pDistinct->addrTnct);
        break;
      }

      default: {
        assert( pDistinct->eTnctType==WHERE_DISTINCT_UNORDERED );
        codeDistinct(pParse, pDistinct->tabTnct, iContinue, nResultCol,
                     regResult);
        break;
      }
    }
    if( pSort==0 ){
      codeOffset(v, p->iOffset, iContinue);
    }
  }

  switch( eDest ){
    /* In this mode, write each query result to the key of the temporary
    ** table iParm.
    */
#ifndef SQLITE_OMIT_COMPOUND_SELECT
    case SRT_Union: {
      int r1;
      r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regResult, nResultCol, r1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, r1, regResult, nResultCol);
      sqlite3ReleaseTempReg(pParse, r1);
      break;
    }

    /* Construct a record from the query result, but instead of
    ** saving that record, use it as a key to delete elements from
    ** the temporary table iParm.
    */
    case SRT_Except: {
      sqlite3VdbeAddOp3(v, OP_IdxDelete, iParm, regResult, nResultCol);
      break;
    }
#endif /* SQLITE_OMIT_COMPOUND_SELECT */

    /* Store the result as data using a unique key.
    */
    case SRT_Fifo:
    case SRT_DistFifo:
    case SRT_Table:
    case SRT_EphemTab: {
      int r1 = sqlite3GetTempRange(pParse, nPrefixReg+1);
      testcase( eDest==SRT_Table );
      testcase( eDest==SRT_EphemTab );
      testcase( eDest==SRT_Fifo );
      testcase( eDest==SRT_DistFifo );
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regResult, nResultCol, r1+nPrefixReg);
#ifndef SQLITE_OMIT_CTE
      if( eDest==SRT_DistFifo ){
        /* If the destination is DistFifo, then cursor (iParm+1) is open
        ** on an ephemeral index. If the current row is already present
        ** in the index, do not write it to the output. If not, add the
        ** current row to the index and proceed with writing it to the
        ** output table as well.  */
        int addr = sqlite3VdbeCurrentAddr(v) + 4;
        sqlite3VdbeAddOp4Int(v, OP_Found, iParm+1, addr, r1, 0);
        VdbeCoverage(v);
        sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm+1, r1,regResult,nResultCol);
        assert( pSort==0 );
      }
#endif
      if( pSort ){
        assert( regResult==regOrig );
        pushOntoSorter(pParse, pSort, p, r1+nPrefixReg, regOrig, 1, nPrefixReg);
      }else{
        int r2 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(v, OP_NewRowid, iParm, r2);
        sqlite3VdbeAddOp3(v, OP_Insert, iParm, r1, r2);
        sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
        sqlite3ReleaseTempReg(pParse, r2);
      }
      sqlite3ReleaseTempRange(pParse, r1, nPrefixReg+1);
      break;
    }

#ifndef SQLITE_OMIT_SUBQUERY
    /* If we are creating a set for an "expr IN (SELECT ...)" construct,
    ** then there should be a single item on the stack.  Write this
    ** item into the set table with bogus data.
    */
    case SRT_Set: {
      if( pSort ){
        /* At first glance you would think we could optimize out the
        ** ORDER BY in this case since the order of entries in the set
        ** does not matter.  But there might be a LIMIT clause, in which
        ** case the order does matter */
        pushOntoSorter(
            pParse, pSort, p, regResult, regOrig, nResultCol, nPrefixReg);
      }else{
        int r1 = sqlite3GetTempReg(pParse);
        assert( sqlite3Strlen30(pDest->zAffSdst)==nResultCol );
        sqlite3VdbeAddOp4(v, OP_MakeRecord, regResult, nResultCol, 
            r1, pDest->zAffSdst, nResultCol);
        sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, r1, regResult, nResultCol);
        sqlite3ReleaseTempReg(pParse, r1);
      }
      break;
    }

    /* If any row exist in the result set, record that fact and abort.
    */
    case SRT_Exists: {
      sqlite3VdbeAddOp2(v, OP_Integer, 1, iParm);
      /* The LIMIT clause will terminate the loop for us */
      break;
    }

    /* If this is a scalar select that is part of an expression, then
    ** store the results in the appropriate memory cell or array of 
    ** memory cells and break out of the scan loop.
    */
    case SRT_Mem: {
      if( pSort ){
        assert( nResultCol<=pDest->nSdst );
        pushOntoSorter(
            pParse, pSort, p, regResult, regOrig, nResultCol, nPrefixReg);
      }else{
        assert( nResultCol==pDest->nSdst );
        assert( regResult==iParm );
        /* The LIMIT clause will jump out of the loop for us */
      }
      break;
    }
#endif /* #ifndef SQLITE_OMIT_SUBQUERY */

    case SRT_Coroutine:       /* Send data to a co-routine */
    case SRT_Output: {        /* Return the results */
      testcase( eDest==SRT_Coroutine );
      testcase( eDest==SRT_Output );
      if( pSort ){
        pushOntoSorter(pParse, pSort, p, regResult, regOrig, nResultCol,
                       nPrefixReg);
      }else if( eDest==SRT_Coroutine ){
        sqlite3VdbeAddOp1(v, OP_Yield, pDest->iSDParm);
      }else{
        sqlite3VdbeAddOp2(v, OP_ResultRow, regResult, nResultCol);
      }
      break;
    }

#ifndef SQLITE_OMIT_CTE
    /* Write the results into a priority queue that is order according to
    ** pDest->pOrderBy (in pSO).  pDest->iSDParm (in iParm) is the cursor for an
    ** index with pSO->nExpr+2 columns.  Build a key using pSO for the first
    ** pSO->nExpr columns, then make sure all keys are unique by adding a
    ** final OP_Sequence column.  The last column is the record as a blob.
    */
    case SRT_DistQueue:
    case SRT_Queue: {
      int nKey;
      int r1, r2, r3;
      int addrTest = 0;
      ExprList *pSO;
      pSO = pDest->pOrderBy;
      assert( pSO );
      nKey = pSO->nExpr;
      r1 = sqlite3GetTempReg(pParse);
      r2 = sqlite3GetTempRange(pParse, nKey+2);
      r3 = r2+nKey+1;
      if( eDest==SRT_DistQueue ){
        /* If the destination is DistQueue, then cursor (iParm+1) is open
        ** on a second ephemeral index that holds all values every previously
        ** added to the queue. */
        addrTest = sqlite3VdbeAddOp4Int(v, OP_Found, iParm+1, 0, 
                                        regResult, nResultCol);
        VdbeCoverage(v);
      }
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regResult, nResultCol, r3);
      if( eDest==SRT_DistQueue ){
        sqlite3VdbeAddOp2(v, OP_IdxInsert, iParm+1, r3);
        sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
      }
      for(i=0; i<nKey; i++){
        sqlite3VdbeAddOp2(v, OP_SCopy,
                          regResult + pSO->a[i].u.x.iOrderByCol - 1,
                          r2+i);
      }
      sqlite3VdbeAddOp2(v, OP_Sequence, iParm, r2+nKey);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, r2, nKey+2, r1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, r1, r2, nKey+2);
      if( addrTest ) sqlite3VdbeJumpHere(v, addrTest);
      sqlite3ReleaseTempReg(pParse, r1);
      sqlite3ReleaseTempRange(pParse, r2, nKey+2);
      break;
    }
#endif /* SQLITE_OMIT_CTE */



#if !defined(SQLITE_OMIT_TRIGGER)
    /* Discard the results.  This is used for SELECT statements inside
    ** the body of a TRIGGER.  The purpose of such selects is to call
    ** user-defined functions that have side effects.  We do not care
    ** about the actual results of the select.
    */
    default: {
      assert( eDest==SRT_Discard );
      break;
    }
#endif
  }

  /* Jump to the end of the loop if the LIMIT is reached.  Except, if
  ** there is a sorter, in which case the sorter has already limited
  ** the output for us.
  */
  if( pSort==0 && p->iLimit ){
    sqlite3VdbeAddOp2(v, OP_DecrJumpZero, p->iLimit, iBreak); VdbeCoverage(v);
  }
}